

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_float_push_back(ImVector_float *self,float v)

{
  float local_4;
  
  ImVector<float>::push_back(self,&local_4);
  return;
}

Assistant:

CIMGUI_API void ImVector_float_push_back(ImVector_float* self,const float v)
{
    return self->push_back(v);
}